

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapValues.cpp
# Opt level: O1

void TTD::NSSnapValues::AssertSnapEquiv
               (ScriptFunctionScopeInfo *funcScopeInfo1,ScriptFunctionScopeInfo *funcScopeInfo2,
               TTDCompareMap *compareMap)

{
  ulong uVar1;
  long lVar2;
  
  TTDCompareMap::DiagnosticAssert
            (compareMap,funcScopeInfo1->ScriptContextLogId == funcScopeInfo2->ScriptContextLogId);
  TTDCompareMap::DiagnosticAssert
            (compareMap,funcScopeInfo1->ScopeCount == funcScopeInfo2->ScopeCount);
  if (funcScopeInfo1->ScopeCount != 0) {
    lVar2 = 0;
    uVar1 = 0;
    do {
      TTDCompareMap::DiagnosticAssert
                (compareMap,
                 *(int *)((long)&funcScopeInfo1->ScopeArray->Tag + lVar2) ==
                 *(int *)((long)&funcScopeInfo2->ScopeArray->Tag + lVar2));
      TTDCompareMap::CheckConsistentAndAddPtrIdMapping_Scope
                (compareMap,*(TTD_PTR_ID *)((long)&funcScopeInfo1->ScopeArray->IDValue + lVar2),
                 *(TTD_PTR_ID *)((long)&funcScopeInfo2->ScopeArray->IDValue + lVar2),(uint32)uVar1);
      uVar1 = uVar1 + 1;
      lVar2 = lVar2 + 0x10;
    } while (uVar1 < funcScopeInfo1->ScopeCount);
  }
  return;
}

Assistant:

void AssertSnapEquiv(const ScriptFunctionScopeInfo* funcScopeInfo1, const ScriptFunctionScopeInfo* funcScopeInfo2, TTDCompareMap& compareMap)
        {
            compareMap.DiagnosticAssert(funcScopeInfo1->ScriptContextLogId == funcScopeInfo2->ScriptContextLogId);

            compareMap.DiagnosticAssert(funcScopeInfo1->ScopeCount == funcScopeInfo2->ScopeCount);
            for(uint32 i = 0; i < funcScopeInfo1->ScopeCount; ++i)
            {
                compareMap.DiagnosticAssert(funcScopeInfo1->ScopeArray[i].Tag == funcScopeInfo2->ScopeArray[i].Tag);
                compareMap.CheckConsistentAndAddPtrIdMapping_Scope(funcScopeInfo1->ScopeArray[i].IDValue, funcScopeInfo2->ScopeArray[i].IDValue, i);
            }
        }